

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmFMove<(moira::Instr)192,(moira::Mode)9,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  u32 ext;
  uint uVar3;
  StrWriter *pSVar4;
  Fp fp;
  Moira *this_00;
  ushort uVar5;
  uint uVar6;
  Ffmt ffmt;
  Ea<(moira::Mode)9,_4> result;
  
  uVar1 = *addr;
  this_00 = this;
  ext = dasmIncRead<2>(this,addr);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    bVar2 = isValidExtFPU(this_00,FMOVE,DIPC,op,ext);
    if (!bVar2) {
      *addr = uVar1;
      dasmIllegal<(moira::Instr)192,(moira::Mode)9,0>(this,str,addr,op);
      return;
    }
  }
  uVar5 = op & 7;
  uVar3 = ext >> 0xd & 7;
  ffmt.raw = ext >> 10 & 7;
  fp.raw = ext >> 7 & 7;
  result.reg = uVar5;
  if (uVar3 == 3) {
    pSVar4 = StrWriter::operator<<(str);
    if (ffmt.raw == 7) {
      StrWriter::operator<<(pSVar4,(Ffmt)0x3);
      StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
      StrWriter::operator<<(pSVar4,fp);
      StrWriter::operator<<(pSVar4);
      result.pc = *addr;
      result.ext1 = dasmIncRead<2>(this,addr);
      StrWriter::operator<<(pSVar4,&result);
      StrWriter::operator<<(str);
      StrWriter::operator<<(str,(Dn)(ext >> 4 & 7));
    }
    else if (ffmt.raw == 3) {
      StrWriter::operator<<(pSVar4,(Ffmt)0x3);
      StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
      StrWriter::operator<<(pSVar4,fp);
      StrWriter::operator<<(pSVar4);
      result.pc = *addr;
      result.ext1 = dasmIncRead<2>(this,addr);
      StrWriter::operator<<(pSVar4,&result);
      StrWriter::operator<<(str,"{");
      pSVar4 = StrWriter::operator<<(str,(Ims<1>)((int)(ext << 0x19) >> 0x19));
      StrWriter::operator<<(pSVar4,"}");
    }
    else {
      StrWriter::operator<<(pSVar4,ffmt);
      StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
      StrWriter::operator<<(pSVar4,fp);
      StrWriter::operator<<(pSVar4);
      result.pc = *addr;
      result.ext1 = dasmIncRead<2>(this,addr);
      StrWriter::operator<<(pSVar4,&result);
    }
  }
  else {
    uVar6 = ext & 0x7f;
    if (uVar3 == 2) {
      if (uVar6 == 0x44) {
        pSVar4 = StrWriter::operator<<(str);
      }
      else if (uVar6 == 0x40) {
        pSVar4 = StrWriter::operator<<();
      }
      else {
        pSVar4 = StrWriter::operator<<();
      }
      StrWriter::operator<<(pSVar4,ffmt);
      StrWriter::operator<<(str,(Tab)(str->tab).raw);
      result.pc = *addr;
      result.ext1 = dasmIncRead<2>(this,addr);
      StrWriter::operator<<(str,&result);
      StrWriter::operator<<(str);
      StrWriter::operator<<(str,fp);
    }
    else if (uVar3 == 0) {
      if (uVar6 == 0x44) {
        pSVar4 = StrWriter::operator<<(str);
      }
      else if (uVar6 == 0x40) {
        pSVar4 = StrWriter::operator<<();
      }
      else {
        pSVar4 = StrWriter::operator<<();
      }
      StrWriter::operator<<(pSVar4,(Ffmt)0x2);
      StrWriter::operator<<(str,(Tab)(str->tab).raw);
      StrWriter::operator<<(str,(Fp)ffmt.raw);
      StrWriter::operator<<(str);
      StrWriter::operator<<(str,fp);
      return;
    }
  }
  return;
}

Assistant:

void
Moira::dasmFMove(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cod = xxx_____________ (ext);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);
    auto fac = _________xxxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (cod) {

        case 0b000:

            if (fac == 0x40) str << Ins<Instr::FSMOVE>{} << Ffmt{2};
            else if (fac == 0x44) str << Ins<Instr::FDMOVE>{} << Ffmt{2};
            else str << Ins<I>{} << Ffmt{2};

            str << str.tab << Fp(src) << Sep{} << Fp(dst);
            break;

        case 0b010:

            if (fac == 0x40) str << Ins<Instr::FSMOVE>{} << Ffmt{src};
            else if (fac == 0x44) str << Ins<Instr::FDMOVE>{} << Ffmt{src};
            else str << Ins<I>{} << Ffmt{src};

            if (M == Mode::IM) {

                u64 val;

                switch (src) {

                    case 0: // Long-Word Integer
                        val = dasmIncRead<Long>(addr);
                        str << str.tab << Ims<Long>(u32(val)) << Sep{} << Fp(dst);
                        break;

                    case 1: // Single precision

                        val = dasmIncRead<Long>(addr);
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 2: // Double precision
                    case 3: // Packed-Decimal Real

                        val = dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr); // Why???
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 5: // Double-precision real

                        val = dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr);
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 6: // Byte Integer
                        val = dasmIncRead<Word>(addr);
                        str << str.tab << Ims<Byte>(u32(val)) << Sep{} << Fp(dst);
                        break;

                    default:
                        str << str.tab << Op<M, Word>(reg, addr) << Sep{} << Fp(dst);
                }
            } else {
                str << str.tab << Op<M, Long>(reg, addr) << Sep{} << Fp(dst);
            }
            break;

        case 0b011:

            switch (src) {

                case 0b011:

                    str << Ins<I>{} << Ffmt{src} << str.tab << Fp(dst) << Sep{} << Op<M, Long>(reg, addr);
                    str << "{" << Ims<Byte>(i8(fac << 1) >> 1) << "}";
                    break;

                case 0b111:

                    str << Ins<I>{} << Ffmt{3} << str.tab << Fp{dst} << Sep{} << Op<M, Long>(reg, addr);
                    str << Sep{} << Dn(fac >> 4);
                    break;

                default:

                    str << Ins<I>{} << Ffmt{src} << str.tab << Fp{dst} << Sep{} << Op<M, Long>(reg, addr);
                    break;
            }
            break;
    }
}